

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall
rsg::ConstructorOp::ConstructorOp
          (ConstructorOp *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  bool bVar1;
  pointer pSVar2;
  pointer pSVar3;
  ValueRangeAccess valueRange_00;
  ConstValueRangeAccess other;
  _Alloc_hider _Var4;
  char cVar5;
  uint uVar6;
  VariableType *pVVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pSVar11;
  Scalar *pSVar12;
  long lVar13;
  ValueRange *this_00;
  pointer pSVar14;
  pointer pcVar15;
  bool bVar16;
  Type inTypes [3];
  ValueRange inValueRange;
  Type local_164 [3];
  long local_158;
  long local_150;
  ValueRange local_148;
  ValueRange *local_c8;
  _Alloc_hider _Stack_c0;
  pointer local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  int local_a0;
  VariableType *local_98;
  pointer pMStack_90;
  pointer local_88;
  pointer pMStack_80;
  VariableType *local_78;
  pointer pcStack_70;
  Scalar *local_68;
  ValueRange *local_60;
  Scalar *pSStack_58;
  Scalar *local_50;
  VariableType *local_48;
  pointer pcStack_40;
  Scalar *local_38;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__ConstructorOp_0018ce08;
  this_00 = &this->m_valueRange;
  ValueRange::ValueRange(this_00,valueRange);
  (this->m_inputExpressions).
  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputExpressions).
  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inputValueRanges).super__Vector_base<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inputValueRanges).super__Vector_base<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inputValueRanges).super__Vector_base<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inputExpressions).
  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((valueRange.m_type)->m_baseType == TYPE_VOID) {
    computeRandomType((VariableType *)&local_c8,state,4);
    ValueRange::ValueRange(&local_148,(VariableType *)&local_c8);
    VariableType::operator=(&this_00->m_type,&local_148.m_type);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&(this->m_valueRange).m_min,&local_148.m_min);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&(this->m_valueRange).m_max,&local_148.m_max);
    ValueRange::~ValueRange(&local_148);
    VariableType::~VariableType((VariableType *)&local_c8);
    pSStack_58 = (this->m_valueRange).m_min.
                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_50 = (this->m_valueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (pSStack_58 ==
        (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pSStack_58 = (Scalar *)0x0;
    }
    if (local_50 ==
        (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_50 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min._0_4_ = (int)pSStack_58;
    valueRange_00.super_ConstValueRangeAccess.m_type = &this_00->m_type;
    valueRange_00.super_ConstValueRangeAccess.m_min._4_4_ = (int)((ulong)pSStack_58 >> 0x20);
    valueRange_00.super_ConstValueRangeAccess.m_max = local_50;
    local_60 = this_00;
    computeRandomValueRange(state,valueRange_00);
  }
  local_158 = (long)(this->m_valueRange).m_type.m_numElements;
  if (0 < local_158) {
    bVar1 = state->m_programParams->useScalarConversions;
    uVar6 = (this->m_valueRange).m_type.m_baseType - TYPE_FLOAT;
    uVar9 = 0xffffffffffffffff;
    if (uVar6 < 3) {
      uVar9 = (ulong)uVar6;
    }
    local_158 = local_158 << 2;
    local_150 = 0;
    do {
      pSVar14 = (this->m_valueRange).m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar2 = (this->m_valueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pSVar11 = (this->m_valueRange).m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar3 = (this->m_valueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar7 = VariableType::getElementType(&this_00->m_type);
      _Var4._M_p = local_148.m_type.m_typeName._M_dataplus._M_p;
      lVar13 = local_150;
      if (pSVar11 == pSVar3) {
        pSVar11 = (pointer)0x0;
      }
      if (pSVar14 == pSVar2) {
        pSVar14 = (pointer)0x0;
      }
      pcVar15 = (pointer)((long)pSVar14 + local_150);
      pSVar12 = (Scalar *)((long)pSVar11 + local_150);
      local_148.m_type.m_typeName._M_dataplus._M_p._0_4_ = SUB84(pcVar15,0);
      local_148.m_type.m_typeName._M_dataplus._M_p._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
      if (bVar1 == false) {
        other.m_min._0_4_ = local_148.m_type.m_typeName._M_dataplus._M_p._0_4_;
        other.m_type = pVVar7;
        other.m_min._4_4_ = local_148.m_type.m_typeName._M_dataplus._M_p._4_4_;
        other.m_max = pSVar12;
        local_148.m_type.m_typeName._M_dataplus._M_p = _Var4._M_p;
        local_78 = pVVar7;
        pcStack_70 = pcVar15;
        local_68 = pSVar12;
        ValueRange::ValueRange(&local_148,other);
        std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::
        emplace_back<rsg::ValueRange>(&this->m_inputValueRanges,&local_148);
      }
      else {
        local_148.m_type._0_8_ = pVVar7;
        local_148.m_type.m_typeName._M_dataplus._M_p = pcVar15;
        local_148.m_type.m_typeName._M_string_length = (size_type)pSVar12;
        cVar5 = (**(code **)((anonymous_namespace)::
                             isConversionOk(rsg::VariableType::Type,rsg::VariableType::Type,rsg::ConstValueRangeAccess)
                             ::convTable + uVar9 * 8))();
        bVar16 = cVar5 != '\0';
        if (bVar16) {
          local_164[0] = TYPE_FLOAT;
        }
        local_148.m_type._0_8_ = pVVar7;
        local_148.m_type.m_typeName._M_dataplus._M_p = pcVar15;
        local_148.m_type.m_typeName._M_string_length = (size_type)pSVar12;
        cVar5 = (**(code **)((anonymous_namespace)::
                             isConversionOk(rsg::VariableType::Type,rsg::VariableType::Type,rsg::ConstValueRangeAccess)
                             ::convTable + uVar9 * 8 + 0x18))();
        uVar10 = (ulong)bVar16;
        if (cVar5 != '\0') {
          uVar10 = (ulong)(bVar16 + 1);
          local_164[bVar16] = TYPE_INT;
        }
        local_148.m_type._0_8_ = pVVar7;
        local_148.m_type.m_typeName._M_dataplus._M_p = pcVar15;
        local_148.m_type.m_typeName._M_string_length = (size_type)pSVar12;
        cVar5 = (**(code **)((anonymous_namespace)::
                             isConversionOk(rsg::VariableType::Type,rsg::VariableType::Type,rsg::ConstValueRangeAccess)
                             ::convTable + uVar9 * 8 + 0x30))();
        uVar8 = uVar10;
        if (cVar5 != '\0') {
          uVar8 = (ulong)((int)uVar10 + 1);
          local_164[uVar10] = TYPE_BOOL;
        }
        local_148.m_type._0_8_ = local_148.m_type._0_8_ & 0xffffffff00000000;
        de::Random::choose<rsg::VariableType::Type*,rsg::VariableType::Type*>
                  (state->m_random,local_164,local_164 + uVar8,(Type *)&local_148,1);
        local_c8 = (ValueRange *)(local_148.m_type._0_8_ & 0xffffffff);
        _Stack_c0._M_p = (pointer)&local_b0;
        local_b8 = (pointer)0x0;
        local_b0._M_local_buf[0] = '\0';
        local_a0 = 1;
        local_88 = (pointer)0x0;
        pMStack_80 = (pointer)0x0;
        local_98 = (VariableType *)0x0;
        pMStack_90 = (pointer)0x0;
        ValueRange::ValueRange(&local_148,(VariableType *)&local_c8);
        VariableType::~VariableType((VariableType *)&local_c8);
        lVar13 = local_150;
        _Stack_c0._M_p = (pointer)(pointer)0x0;
        if (local_148.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_148.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          _Stack_c0._M_p =
               (pointer)local_148.m_min.
                        super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                        super__Vector_impl_data._M_start;
        }
        local_b8 = (pointer)0x0;
        if (local_148.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_148.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_b8 = local_148.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        }
        uVar6 = pVVar7->m_baseType - TYPE_FLOAT;
        uVar10 = (ulong)uVar6;
        if (2 < uVar6) {
          uVar10 = 0xffffffffffffffff;
        }
        uVar8 = 0xffffffffffffffff;
        if (local_148.m_type.m_baseType - TYPE_FLOAT < 3) {
          uVar8 = (ulong)(local_148.m_type.m_baseType - TYPE_FLOAT);
        }
        local_c8 = &local_148;
        local_48 = pVVar7;
        pcStack_40 = pcVar15;
        local_38 = pSVar12;
        (**(code **)((anonymous_namespace)::
                     convertValueRange(rsg::ConstValueRangeAccess,rsg::ValueRangeAccess)::convTable
                    + uVar8 * 8 + uVar10 * 0x18))();
        std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::push_back
                  (&this->m_inputValueRanges,&local_148);
      }
      ValueRange::~ValueRange(&local_148);
      local_150 = lVar13 + 4;
    } while (local_158 != local_150);
  }
  return;
}

Assistant:

ConstructorOp::ConstructorOp (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_valueRange(valueRange)
{
	if (valueRange.getType().isVoid())
	{
		// Use random range
		const int maxScalars = 4; // We don't have to be able to assign this value to anywhere
		m_valueRange = ValueRange(computeRandomType(state, maxScalars));
		computeRandomValueRange(state, m_valueRange.asAccess());
	}

	// \todo [2011-03-26 pyry] Vector conversions
//	int						remainingDepth	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();

	const VariableType&		type			= m_valueRange.getType();
	VariableType::Type		baseType		= type.getBaseType();
	int						numScalars		= type.getNumElements();
	int						curScalarNdx	= 0;

	// \todo [2011-03-26 pyry] Separate op for struct constructors!
	DE_ASSERT(type.isFloatOrVec() || type.isIntOrVec() || type.isBoolOrVec());

	bool scalarConversions = state.getProgramParameters().useScalarConversions;

	while (curScalarNdx < numScalars)
	{
		ConstValueRangeAccess comp = m_valueRange.asAccess().component(curScalarNdx);

		if (scalarConversions)
		{
			int					numInTypes = 0;
			VariableType::Type	inTypes[3];

			if (isConversionOk(VariableType::TYPE_FLOAT, baseType, comp))	inTypes[numInTypes++] = VariableType::TYPE_FLOAT;
			if (isConversionOk(VariableType::TYPE_INT, baseType, comp))		inTypes[numInTypes++] = VariableType::TYPE_INT;
			if (isConversionOk(VariableType::TYPE_BOOL, baseType, comp))	inTypes[numInTypes++] = VariableType::TYPE_BOOL;

			DE_ASSERT(numInTypes > 0); // At least nop conversion should be ok

			// Choose random
			VariableType::Type inType = state.getRandom().choose<VariableType::Type>(&inTypes[0], &inTypes[0] + numInTypes);

			// Compute converted value range
			ValueRange inValueRange(VariableType(inType, 1));
			convertValueRange(comp, inValueRange);
			m_inputValueRanges.push_back(inValueRange);

			curScalarNdx += 1;
		}
		else
		{
			m_inputValueRanges.push_back(ValueRange(comp));
			curScalarNdx += 1;
		}
	}
}